

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ExtractPalettedAlphaRows(VP8LDecoder *dec,int last_row)

{
  int stride;
  VP8Io *pVVar1;
  ALPHDecoder *alph_dec;
  uint8_t *puVar2;
  int *piVar3;
  int y_start;
  
  pVVar1 = dec->io_;
  alph_dec = (ALPHDecoder *)pVVar1->opaque;
  piVar3 = &dec->last_row_;
  if (alph_dec->filter_ < WEBP_FILTER_VERTICAL) {
    piVar3 = &pVVar1->crop_top;
  }
  y_start = *piVar3;
  if (*piVar3 < dec->last_row_) {
    y_start = dec->last_row_;
  }
  if (y_start < last_row) {
    stride = pVVar1->width;
    puVar2 = alph_dec->output_;
    VP8LColorIndexInverseTransformAlpha
              (dec->transforms_,y_start,last_row,
               (uint8_t *)((long)y_start * (long)dec->width_ + (long)dec->pixels_),
               puVar2 + stride * y_start);
    AlphaApplyFilter(alph_dec,y_start,last_row,puVar2 + stride * y_start,stride);
  }
  dec->last_out_row_ = last_row;
  dec->last_row_ = last_row;
  return;
}

Assistant:

static void ExtractPalettedAlphaRows(VP8LDecoder* const dec, int last_row) {
  // For vertical and gradient filtering, we need to decode the part above the
  // crop_top row, in order to have the correct spatial predictors.
  ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io_->opaque;
  const int top_row =
      (alph_dec->filter_ == WEBP_FILTER_NONE ||
       alph_dec->filter_ == WEBP_FILTER_HORIZONTAL) ? dec->io_->crop_top
                                                    : dec->last_row_;
  const int first_row = (dec->last_row_ < top_row) ? top_row : dec->last_row_;
  assert(last_row <= dec->io_->crop_bottom);
  if (last_row > first_row) {
    // Special method for paletted alpha data. We only process the cropped area.
    const int width = dec->io_->width;
    uint8_t* out = alph_dec->output_ + width * first_row;
    const uint8_t* const in =
      (uint8_t*)dec->pixels_ + dec->width_ * first_row;
    VP8LTransform* const transform = &dec->transforms_[0];
    assert(dec->next_transform_ == 1);
    assert(transform->type_ == COLOR_INDEXING_TRANSFORM);
    VP8LColorIndexInverseTransformAlpha(transform, first_row, last_row,
                                        in, out);
    AlphaApplyFilter(alph_dec, first_row, last_row, out, width);
  }
  dec->last_row_ = dec->last_out_row_ = last_row;
}